

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding_x86.cpp
# Opt level: O1

int __thiscall
ncnn::Padding_x86::forward(Padding_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  long lVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  int *piVar7;
  size_t sVar8;
  bool bVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined1 uVar15;
  undefined1 uVar17;
  undefined1 uVar19;
  undefined1 uVar21;
  undefined4 uVar22;
  undefined1 uVar23;
  undefined1 uVar25;
  undefined1 uVar27;
  undefined1 uVar29;
  undefined8 uVar30;
  undefined4 in_EAX;
  int iVar37;
  uint uVar38;
  int iVar39;
  ulong uVar40;
  undefined8 *puVar41;
  uint uVar42;
  int unaff_EBP;
  int iVar43;
  float *outptr;
  undefined1 __ptr [8];
  int iVar44;
  float *pfVar45;
  int iVar46;
  int iVar47;
  size_t sVar48;
  ulong uVar49;
  int iVar50;
  float *pfVar51;
  ulong uVar52;
  float *pfVar53;
  long lVar54;
  bool bVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  undefined1 auVar60 [16];
  __m128 pad_value;
  Mat m_1;
  __m128 pad_value_2;
  undefined1 local_118 [8];
  float fStack_110;
  float fStack_10c;
  float local_108;
  undefined4 uStack_104;
  int local_100;
  Allocator *local_f8;
  float local_f0;
  float fStack_ec;
  int iStack_e8;
  int iStack_e4;
  int iStack_e0;
  size_t local_d8;
  ulong local_d0;
  ulong local_c8;
  Option *local_c0;
  Mat local_b8;
  ulong local_70;
  int local_68;
  int local_64;
  ulong local_60;
  ulong local_58;
  int local_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  ulong local_38;
  undefined4 uVar16;
  undefined3 uVar18;
  undefined2 uVar20;
  undefined4 uVar24;
  undefined3 uVar26;
  undefined2 uVar28;
  undefined1 uVar31;
  undefined1 uVar32;
  undefined3 uVar33;
  undefined1 uVar34;
  undefined2 uVar35;
  undefined1 uVar36;
  
  uVar3 = (this->super_Padding).top;
  uVar4 = (this->super_Padding).bottom;
  uVar5 = (this->super_Padding).left;
  uVar6 = (this->super_Padding).right;
  auVar60._0_4_ = -(uint)(uVar3 == 0);
  auVar60._4_4_ = -(uint)(uVar4 == 0);
  auVar60._8_4_ = -(uint)(uVar5 == 0);
  auVar60._12_4_ = -(uint)(uVar6 == 0);
  iVar37 = movmskps(in_EAX,auVar60);
  if (((iVar37 == 0xf) && ((this->super_Padding).front == 0)) && ((this->super_Padding).behind == 0)
     ) {
    if (top_blob == bottom_blob) {
      return 0;
    }
    piVar7 = bottom_blob->refcount;
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + 1;
      UNLOCK();
    }
    piVar7 = top_blob->refcount;
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + -1;
      UNLOCK();
      if (*piVar7 == 0) {
        if (top_blob->allocator == (Allocator *)0x0) {
          if (top_blob->data != (void *)0x0) {
            free(top_blob->data);
          }
        }
        else {
          (*top_blob->allocator->_vptr_Allocator[3])();
        }
      }
    }
    top_blob->cstep = 0;
    top_blob->data = (void *)0x0;
    top_blob->refcount = (int *)0x0;
    *(undefined1 (*) [16])((long)&top_blob->refcount + 4) = (undefined1  [16])0x0;
    top_blob->dims = 0;
    top_blob->w = 0;
    top_blob->h = 0;
    top_blob->d = 0;
    top_blob->c = 0;
    piVar7 = bottom_blob->refcount;
    top_blob->data = bottom_blob->data;
    top_blob->refcount = piVar7;
    top_blob->elemsize = bottom_blob->elemsize;
    top_blob->elempack = bottom_blob->elempack;
    top_blob->allocator = bottom_blob->allocator;
    iVar37 = bottom_blob->w;
    iVar47 = bottom_blob->h;
    iVar39 = bottom_blob->d;
    top_blob->dims = bottom_blob->dims;
    top_blob->w = iVar37;
    top_blob->h = iVar47;
    top_blob->d = iVar39;
    top_blob->c = bottom_blob->c;
    top_blob->cstep = bottom_blob->cstep;
    return 0;
  }
  iVar37 = bottom_blob->elempack;
  if ((iVar37 != 0) && (((int)bottom_blob->elemsize << 3) / iVar37 == 8)) {
    iVar37 = forward_int8(this,bottom_blob,top_blob,opt);
    return iVar37;
  }
  local_c0 = opt;
  if (iVar37 == 4) {
    local_d0 = (ulong)(uint)bottom_blob->w;
    local_58 = (ulong)(uint)bottom_blob->h;
    local_64 = bottom_blob->d;
    local_70 = (ulong)(uint)bottom_blob->c;
    iVar47 = bottom_blob->dims;
    local_c8 = bottom_blob->elemsize;
    if (iVar47 == 1) {
      bVar9 = ((uVar5 | uVar6 + uVar5) & 3) == 0;
      bVar55 = (this->super_Padding).type == 0;
      if (bVar9 && bVar55) {
        Mat::create(top_blob,uVar6 + uVar5 + bottom_blob->w * 4 >> 2,local_c8 & 0xfffffffffffffffc,4
                    ,opt->blob_allocator);
        unaff_EBP = -100;
        if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
          local_118._0_4_ = (this->super_Padding).value;
          iVar39 = (this->super_Padding).left;
          iVar50 = (this->super_Padding).right;
          iVar43 = iVar39 + 3;
          if (-1 < iVar39) {
            iVar43 = iVar39;
          }
          iVar39 = iVar50 + 3;
          if (-1 < iVar50) {
            iVar39 = iVar50;
          }
          unaff_EBP = 0;
          fStack_110 = (float)local_118._0_4_;
          local_118._4_4_ = local_118._0_4_;
          fStack_10c = fStack_110;
          padding_constant_pack4_sse
                    (bottom_blob,top_blob,0,0,iVar43 >> 2,iVar39 >> 2,(__m128 *)local_118);
        }
      }
      if (bVar9 && bVar55) {
        return unaff_EBP;
      }
    }
    if (iVar47 == 2) {
      uVar38 = (this->super_Padding).top;
      uVar42 = uVar38 + (int)local_58 * 4 + (this->super_Padding).bottom;
      bVar9 = ((uVar38 | uVar42) & 3) == 0;
      bVar55 = (this->super_Padding).type == 0;
      if (bVar9 && bVar55) {
        Mat::create(top_blob,(this->super_Padding).left + (int)local_d0 +
                             (this->super_Padding).right,(int)uVar42 >> 2,
                    local_c8 & 0xfffffffffffffffc,4,local_c0->blob_allocator);
        unaff_EBP = -100;
        if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
          local_118._0_4_ = (this->super_Padding).value;
          iVar39 = (this->super_Padding).top;
          iVar50 = (this->super_Padding).bottom;
          iVar43 = iVar39 + 3;
          if (-1 < iVar39) {
            iVar43 = iVar39;
          }
          iVar39 = iVar50 + 3;
          if (-1 < iVar50) {
            iVar39 = iVar50;
          }
          fStack_110 = (float)local_118._0_4_;
          local_118._4_4_ = local_118._0_4_;
          fStack_10c = fStack_110;
          padding_constant_pack4_sse
                    (bottom_blob,top_blob,iVar43 >> 2,iVar39 >> 2,(this->super_Padding).left,
                     (this->super_Padding).right,(__m128 *)local_118);
          unaff_EBP = 0;
        }
      }
      if (bVar9 && bVar55) {
        return unaff_EBP;
      }
    }
    if (iVar47 == 3) {
      uVar38 = (this->super_Padding).front;
      uVar42 = uVar38 + (int)local_70 * 4 + (this->super_Padding).behind;
      bVar55 = (uVar42 & 3) == 0;
      bVar9 = true;
      local_4c = iVar47;
      if ((uVar38 & 3) == 0 && bVar55) {
        if ((uVar42 == (int)local_70 * 4) || ((this->super_Padding).type == 0)) {
          iVar47 = (uint)bVar55 * 3 + 1;
          uVar49 = (long)(int)uVar42 / (long)iVar47;
          iVar39 = (int)uVar49;
          Mat::create(top_blob,(this->super_Padding).left + (int)local_d0 +
                               (this->super_Padding).right,
                      (this->super_Padding).top + (int)local_58 + (this->super_Padding).bottom,
                      iVar39,(local_c8 >> 2) << bVar55 * '\x02',iVar47,local_c0->blob_allocator);
          unaff_EBP = -100;
          if (top_blob->data == (void *)0x0) {
            bVar9 = false;
          }
          else {
            bVar9 = false;
            if ((long)top_blob->c * top_blob->cstep != 0) {
              iVar47 = (this->super_Padding).front;
              iVar50 = iVar47 + 3;
              if (-1 < iVar47) {
                iVar50 = iVar47;
              }
              if (0 < iVar39) {
                local_68 = -(iVar50 >> 2);
                local_38 = uVar49 & 0xffffffff;
                uVar49 = 0;
                do {
                  fStack_ec = (float)top_blob->w;
                  iStack_e8 = top_blob->h;
                  iStack_e0 = top_blob->d;
                  uVar40 = top_blob->elemsize;
                  __ptr = (undefined1  [8])
                          (top_blob->cstep * uVar49 * uVar40 + (long)top_blob->data);
                  local_100 = top_blob->elempack;
                  local_f8 = top_blob->allocator;
                  fStack_110 = 0.0;
                  fStack_10c = 0.0;
                  local_108 = (float)uVar40;
                  uStack_104 = (undefined4)(uVar40 >> 0x20);
                  iStack_e4 = 1;
                  local_f0 = (float)(top_blob->dims + -1);
                  local_d8 = (uVar40 * (long)iStack_e8 * (long)(int)fStack_ec + 0xf &
                             0xfffffffffffffff0) / uVar40;
                  if (top_blob->dims == 4) {
                    local_d8 = (long)iStack_e8 * (long)(int)fStack_ec;
                  }
                  if ((this->super_Padding).per_channel_pad_data_size == 0) {
                    local_48 = (this->super_Padding).value;
                    fStack_44 = local_48;
                    fStack_40 = local_48;
                    fStack_3c = local_48;
                  }
                  else {
                    pfVar53 = (float *)((long)(this->super_Padding).per_channel_pad_data.data +
                                       uVar49 * 0x10);
                    local_48 = *pfVar53;
                    fStack_44 = pfVar53[1];
                    fStack_40 = pfVar53[2];
                    fStack_3c = pfVar53[3];
                  }
                  uVar38 = local_68 + (int)uVar49;
                  if ((int)uVar38 < 0 || (int)local_70 <= (int)uVar38) {
                    iVar47 = iStack_e0 * (int)local_d8;
                    pfVar53 = (float *)__ptr;
                    if (0 < iVar47) {
                      do {
                        *pfVar53 = local_48;
                        pfVar53[1] = fStack_44;
                        pfVar53[2] = fStack_40;
                        pfVar53[3] = fStack_3c;
                        pfVar53 = pfVar53 + 4;
                        iVar47 = iVar47 + -1;
                      } while (iVar47 != 0);
                    }
                  }
                  else {
                    local_b8.w = bottom_blob->w;
                    local_b8.h = bottom_blob->h;
                    local_b8.c = bottom_blob->d;
                    uVar40 = bottom_blob->elemsize;
                    pfVar53 = (float *)((ulong)uVar38 * bottom_blob->cstep * uVar40 +
                                       (long)bottom_blob->data);
                    local_b8.elempack = bottom_blob->elempack;
                    local_b8.allocator = bottom_blob->allocator;
                    local_b8.refcount._0_4_ = 0;
                    local_b8.refcount._4_4_ = 0;
                    local_b8.elemsize._0_4_ = (undefined4)uVar40;
                    local_b8.elemsize._4_4_ = (undefined4)(uVar40 >> 0x20);
                    local_b8.d = 1;
                    local_b8.dims = bottom_blob->dims + -1;
                    local_b8.cstep =
                         (uVar40 * (long)local_b8.h * (long)local_b8.w + 0xf & 0xfffffffffffffff0) /
                         uVar40;
                    if (bottom_blob->dims == 4) {
                      local_b8.cstep = (long)local_b8.h * (long)local_b8.w;
                    }
                    local_b8.data = pfVar53;
                    local_118 = __ptr;
                    if ((this->super_Padding).type == 0) {
                      padding_constant_pack4_sse
                                (&local_b8,(Mat *)local_118,(this->super_Padding).top,
                                 (this->super_Padding).bottom,(this->super_Padding).left,
                                 (this->super_Padding).right,(__m128 *)&local_48);
                    }
                    if ((this->super_Padding).type == 1) {
                      iVar47 = (this->super_Padding).top;
                      iVar39 = (this->super_Padding).bottom;
                      iVar50 = (this->super_Padding).left;
                      iVar43 = (this->super_Padding).right;
                      if (0 < iVar47) {
                        iVar44 = 0;
                        do {
                          fVar56 = *pfVar53;
                          fVar57 = pfVar53[1];
                          fVar58 = pfVar53[2];
                          fVar59 = pfVar53[3];
                          iVar46 = iVar50;
                          if (0 < iVar50) {
                            do {
                              *(float *)__ptr = fVar56;
                              *(float *)((long)__ptr + 4) = fVar57;
                              *(float *)((long)__ptr + 8) = fVar58;
                              *(float *)((long)__ptr + 0xc) = fVar59;
                              __ptr = (undefined1  [8])((long)__ptr + 0x10);
                              iVar46 = iVar46 + -1;
                            } while (iVar46 != 0);
                          }
                          if (0 < local_b8.w) {
                            iVar46 = 0;
                            pfVar45 = pfVar53;
                            do {
                              fVar56 = *pfVar45;
                              fVar57 = pfVar45[1];
                              fVar58 = pfVar45[2];
                              fVar59 = pfVar45[3];
                              *(float *)__ptr = fVar56;
                              *(float *)((long)__ptr + 4) = fVar57;
                              *(float *)((long)__ptr + 8) = fVar58;
                              *(float *)((long)__ptr + 0xc) = fVar59;
                              pfVar45 = pfVar45 + 4;
                              __ptr = (undefined1  [8])((long)__ptr + 0x10);
                              iVar46 = iVar46 + 1;
                            } while (iVar46 < local_b8.w);
                          }
                          iVar46 = iVar43;
                          if (0 < iVar43) {
                            do {
                              *(float *)__ptr = fVar56;
                              *(float *)((long)__ptr + 4) = fVar57;
                              *(float *)((long)__ptr + 8) = fVar58;
                              *(float *)((long)__ptr + 0xc) = fVar59;
                              __ptr = (undefined1  [8])((long)__ptr + 0x10);
                              iVar46 = iVar46 + -1;
                            } while (iVar46 != 0);
                          }
                          iVar44 = iVar44 + 1;
                        } while (iVar44 != iVar47);
                      }
                      if (0 < local_b8.h) {
                        iVar47 = 0;
                        do {
                          fVar56 = *pfVar53;
                          fVar57 = pfVar53[1];
                          fVar58 = pfVar53[2];
                          fVar59 = pfVar53[3];
                          iVar44 = iVar50;
                          if (0 < iVar50) {
                            do {
                              *(float *)__ptr = fVar56;
                              *(float *)((long)__ptr + 4) = fVar57;
                              *(float *)((long)__ptr + 8) = fVar58;
                              *(float *)((long)__ptr + 0xc) = fVar59;
                              __ptr = (undefined1  [8])((long)__ptr + 0x10);
                              iVar44 = iVar44 + -1;
                            } while (iVar44 != 0);
                          }
                          if (0 < local_b8.w) {
                            iVar44 = 0;
                            do {
                              fVar56 = *pfVar53;
                              fVar57 = pfVar53[1];
                              fVar58 = pfVar53[2];
                              fVar59 = pfVar53[3];
                              *(float *)__ptr = fVar56;
                              *(float *)((long)__ptr + 4) = fVar57;
                              *(float *)((long)__ptr + 8) = fVar58;
                              *(float *)((long)__ptr + 0xc) = fVar59;
                              pfVar53 = pfVar53 + 4;
                              __ptr = (undefined1  [8])((long)__ptr + 0x10);
                              iVar44 = iVar44 + 1;
                            } while (iVar44 < local_b8.w);
                          }
                          iVar44 = iVar43;
                          if (0 < iVar43) {
                            do {
                              *(float *)__ptr = fVar56;
                              *(float *)((long)__ptr + 4) = fVar57;
                              *(float *)((long)__ptr + 8) = fVar58;
                              *(float *)((long)__ptr + 0xc) = fVar59;
                              __ptr = (undefined1  [8])((long)__ptr + 0x10);
                              iVar44 = iVar44 + -1;
                            } while (iVar44 != 0);
                          }
                          iVar47 = iVar47 + 1;
                        } while (iVar47 < local_b8.h);
                      }
                      if (0 < iVar39) {
                        pfVar53 = pfVar53 + (long)local_b8.w * -4;
                        iVar47 = 0;
                        do {
                          fVar56 = *pfVar53;
                          fVar57 = pfVar53[1];
                          fVar58 = pfVar53[2];
                          fVar59 = pfVar53[3];
                          iVar44 = iVar50;
                          if (0 < iVar50) {
                            do {
                              *(float *)__ptr = fVar56;
                              *(float *)((long)__ptr + 4) = fVar57;
                              *(float *)((long)__ptr + 8) = fVar58;
                              *(float *)((long)__ptr + 0xc) = fVar59;
                              __ptr = (undefined1  [8])((long)__ptr + 0x10);
                              iVar44 = iVar44 + -1;
                            } while (iVar44 != 0);
                          }
                          if (0 < local_b8.w) {
                            iVar44 = 0;
                            pfVar45 = pfVar53;
                            do {
                              fVar56 = *pfVar45;
                              fVar57 = pfVar45[1];
                              fVar58 = pfVar45[2];
                              fVar59 = pfVar45[3];
                              *(float *)__ptr = fVar56;
                              *(float *)((long)__ptr + 4) = fVar57;
                              *(float *)((long)__ptr + 8) = fVar58;
                              *(float *)((long)__ptr + 0xc) = fVar59;
                              pfVar45 = pfVar45 + 4;
                              __ptr = (undefined1  [8])((long)__ptr + 0x10);
                              iVar44 = iVar44 + 1;
                            } while (iVar44 < local_b8.w);
                          }
                          iVar44 = iVar43;
                          if (0 < iVar43) {
                            do {
                              *(float *)__ptr = fVar56;
                              *(float *)((long)__ptr + 4) = fVar57;
                              *(float *)((long)__ptr + 8) = fVar58;
                              *(float *)((long)__ptr + 0xc) = fVar59;
                              __ptr = (undefined1  [8])((long)__ptr + 0x10);
                              iVar44 = iVar44 + -1;
                            } while (iVar44 != 0);
                          }
                          iVar47 = iVar47 + 1;
                        } while (iVar47 != iVar39);
                      }
                    }
                    if ((this->super_Padding).type == 2) {
                      iVar47 = (this->super_Padding).top;
                      iVar39 = (this->super_Padding).bottom;
                      uVar38 = (this->super_Padding).left;
                      uVar40 = (ulong)uVar38;
                      uVar42 = (this->super_Padding).right;
                      uVar52 = (ulong)uVar42;
                      pfVar45 = (float *)((long)local_b8.data + (long)(local_b8.w * iVar47 * 4) * 4)
                      ;
                      pfVar53 = (float *)local_118;
                      if (0 < iVar47) {
                        iVar50 = 0;
                        do {
                          lVar54 = uVar40 << 4;
                          if (0 < (int)uVar38) {
                            do {
                              pfVar51 = (float *)((long)pfVar45 + lVar54);
                              fVar56 = pfVar51[1];
                              fVar57 = pfVar51[2];
                              fVar58 = pfVar51[3];
                              *pfVar53 = *pfVar51;
                              pfVar53[1] = fVar56;
                              pfVar53[2] = fVar57;
                              pfVar53[3] = fVar58;
                              pfVar53 = pfVar53 + 4;
                              lVar54 = lVar54 + -0x10;
                            } while (lVar54 != 0);
                          }
                          pfVar51 = pfVar45;
                          if (0 < local_b8.w) {
                            iVar43 = 0;
                            do {
                              fVar56 = pfVar51[1];
                              fVar57 = pfVar51[2];
                              fVar58 = pfVar51[3];
                              *pfVar53 = *pfVar51;
                              pfVar53[1] = fVar56;
                              pfVar53[2] = fVar57;
                              pfVar53[3] = fVar58;
                              pfVar51 = pfVar51 + 4;
                              pfVar53 = pfVar53 + 4;
                              iVar43 = iVar43 + 1;
                            } while (iVar43 < local_b8.w);
                          }
                          if (0 < (int)uVar42) {
                            lVar54 = -0x20;
                            do {
                              pfVar1 = (float *)((long)pfVar51 + lVar54);
                              fVar56 = pfVar1[1];
                              fVar57 = pfVar1[2];
                              fVar58 = pfVar1[3];
                              *pfVar53 = *pfVar1;
                              pfVar53[1] = fVar56;
                              pfVar53[2] = fVar57;
                              pfVar53[3] = fVar58;
                              pfVar53 = pfVar53 + 4;
                              lVar2 = uVar52 * 0x10 + lVar54;
                              lVar54 = lVar54 + -0x10;
                            } while (lVar2 != -0x10);
                          }
                          pfVar45 = pfVar45 + (long)local_b8.w * -4;
                          iVar50 = iVar50 + 1;
                        } while (iVar50 != iVar47);
                      }
                      if (0 < local_b8.h) {
                        iVar47 = 0;
                        do {
                          lVar54 = uVar40 << 4;
                          if (0 < (int)uVar38) {
                            do {
                              pfVar51 = (float *)((long)pfVar45 + lVar54);
                              fVar56 = pfVar51[1];
                              fVar57 = pfVar51[2];
                              fVar58 = pfVar51[3];
                              *pfVar53 = *pfVar51;
                              pfVar53[1] = fVar56;
                              pfVar53[2] = fVar57;
                              pfVar53[3] = fVar58;
                              pfVar53 = pfVar53 + 4;
                              lVar54 = lVar54 + -0x10;
                            } while (lVar54 != 0);
                          }
                          if (0 < local_b8.w) {
                            iVar50 = 0;
                            do {
                              fVar56 = pfVar45[1];
                              fVar57 = pfVar45[2];
                              fVar58 = pfVar45[3];
                              *pfVar53 = *pfVar45;
                              pfVar53[1] = fVar56;
                              pfVar53[2] = fVar57;
                              pfVar53[3] = fVar58;
                              pfVar45 = pfVar45 + 4;
                              pfVar53 = pfVar53 + 4;
                              iVar50 = iVar50 + 1;
                            } while (iVar50 < local_b8.w);
                          }
                          if (0 < (int)uVar42) {
                            lVar54 = -0x20;
                            do {
                              pfVar51 = (float *)((long)pfVar45 + lVar54);
                              fVar56 = pfVar51[1];
                              fVar57 = pfVar51[2];
                              fVar58 = pfVar51[3];
                              *pfVar53 = *pfVar51;
                              pfVar53[1] = fVar56;
                              pfVar53[2] = fVar57;
                              pfVar53[3] = fVar58;
                              pfVar53 = pfVar53 + 4;
                              lVar2 = uVar52 * 0x10 + lVar54;
                              lVar54 = lVar54 + -0x10;
                            } while (lVar2 != -0x10);
                          }
                          iVar47 = iVar47 + 1;
                        } while (iVar47 < local_b8.h);
                      }
                      if (0 < iVar39) {
                        pfVar45 = pfVar45 + (long)local_b8.w * -8;
                        iVar47 = 0;
                        do {
                          lVar54 = uVar40 << 4;
                          if (0 < (int)uVar38) {
                            do {
                              pfVar51 = (float *)((long)pfVar45 + lVar54);
                              fVar56 = pfVar51[1];
                              fVar57 = pfVar51[2];
                              fVar58 = pfVar51[3];
                              *pfVar53 = *pfVar51;
                              pfVar53[1] = fVar56;
                              pfVar53[2] = fVar57;
                              pfVar53[3] = fVar58;
                              pfVar53 = pfVar53 + 4;
                              lVar54 = lVar54 + -0x10;
                            } while (lVar54 != 0);
                          }
                          pfVar51 = pfVar45;
                          if (0 < local_b8.w) {
                            iVar50 = 0;
                            do {
                              fVar56 = pfVar51[1];
                              fVar57 = pfVar51[2];
                              fVar58 = pfVar51[3];
                              *pfVar53 = *pfVar51;
                              pfVar53[1] = fVar56;
                              pfVar53[2] = fVar57;
                              pfVar53[3] = fVar58;
                              pfVar51 = pfVar51 + 4;
                              pfVar53 = pfVar53 + 4;
                              iVar50 = iVar50 + 1;
                            } while (iVar50 < local_b8.w);
                          }
                          if (0 < (int)uVar42) {
                            lVar54 = -0x20;
                            do {
                              pfVar1 = (float *)((long)pfVar51 + lVar54);
                              fVar56 = pfVar1[1];
                              fVar57 = pfVar1[2];
                              fVar58 = pfVar1[3];
                              *pfVar53 = *pfVar1;
                              pfVar53[1] = fVar56;
                              pfVar53[2] = fVar57;
                              pfVar53[3] = fVar58;
                              pfVar53 = pfVar53 + 4;
                              lVar2 = uVar52 * 0x10 + lVar54;
                              lVar54 = lVar54 + -0x10;
                            } while (lVar2 != -0x10);
                          }
                          pfVar45 = pfVar45 + (long)local_b8.w * -4;
                          iVar47 = iVar47 + 1;
                        } while (iVar47 != iVar39);
                      }
                    }
                    piVar7 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
                    local_60 = uVar49;
                    __ptr = local_118;
                    if (piVar7 != (int *)0x0) {
                      LOCK();
                      *piVar7 = *piVar7 + -1;
                      UNLOCK();
                      if (*piVar7 == 0) {
                        if (local_b8.allocator == (Allocator *)0x0) {
                          if ((float *)local_b8.data != (float *)0x0) {
                            free(local_b8.data);
                            __ptr = local_118;
                          }
                        }
                        else {
                          (*(local_b8.allocator)->_vptr_Allocator[3])();
                          __ptr = local_118;
                        }
                      }
                    }
                    local_b8.cstep = 0;
                    local_b8.data = (void *)0x0;
                    local_b8.refcount._0_4_ = 0;
                    local_b8.refcount._4_4_ = 0;
                    local_b8.elemsize._0_4_ = 0;
                    local_b8.elemsize._4_4_ = 0;
                    local_b8.elempack = 0;
                    local_b8.dims = 0;
                    local_b8.w = 0;
                    local_b8.h = 0;
                    local_b8.d = 0;
                    local_b8.c = 0;
                    uVar49 = local_60;
                  }
                  piVar7 = (int *)CONCAT44(fStack_10c,fStack_110);
                  if (piVar7 != (int *)0x0) {
                    LOCK();
                    *piVar7 = *piVar7 + -1;
                    UNLOCK();
                    if (*piVar7 == 0) {
                      local_118 = __ptr;
                      if (local_f8 == (Allocator *)0x0) {
                        if (__ptr != (undefined1  [8])0x0) {
                          free((void *)__ptr);
                        }
                      }
                      else {
                        (*local_f8->_vptr_Allocator[3])();
                      }
                    }
                  }
                  local_d8 = 0;
                  local_118._0_4_ = 0.0;
                  local_118._4_4_ = 0.0;
                  fStack_110 = 0.0;
                  uStack_104 = 0;
                  local_100 = 0;
                  iStack_e8 = 0;
                  iStack_e4 = 0;
                  iStack_e0 = 0;
                  uVar49 = uVar49 + 1;
                  fStack_10c = (float)local_118._0_4_;
                  local_108 = (float)local_118._4_4_;
                  local_f0 = (float)local_118._0_4_;
                  fStack_ec = (float)local_118._4_4_;
                } while (uVar49 != local_38);
              }
              bVar9 = false;
              unaff_EBP = 0;
            }
          }
        }
      }
      iVar47 = local_4c;
      if (!bVar9) {
        return unaff_EBP;
      }
    }
    if (iVar47 == 4) {
      iVar47 = (this->super_Padding).type;
      if (iVar47 == 0) {
        iVar39 = (this->super_Padding).front + local_64 + (this->super_Padding).behind;
        iVar50 = (int)local_d0;
        local_d0 = CONCAT44(local_d0._4_4_,iVar39);
        Mat::create(top_blob,iVar50 + (this->super_Padding).left + (this->super_Padding).right,
                    (int)local_58 + (this->super_Padding).top + (this->super_Padding).bottom,iVar39,
                    (int)local_70,local_c8,4,local_c0->blob_allocator);
        unaff_EBP = -100;
        if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
          if ((int)local_70 < 1) {
            unaff_EBP = 0;
          }
          else {
            local_c8 = local_c8 & 0xffffffff00000000;
            uVar40 = local_d0 & 0xffffffff;
            uVar49 = 0;
            do {
              if ((this->super_Padding).per_channel_pad_data_size == 0) {
                local_48 = (this->super_Padding).value;
                fStack_44 = local_48;
                fStack_40 = local_48;
                fStack_3c = local_48;
              }
              else {
                pfVar53 = (float *)((long)(this->super_Padding).per_channel_pad_data.data +
                                   uVar49 * 0x10);
                local_48 = *pfVar53;
                fStack_44 = pfVar53[1];
                fStack_40 = pfVar53[2];
                fStack_3c = pfVar53[3];
              }
              if (0 < (int)local_d0) {
                uVar52 = 0;
                do {
                  fStack_ec = (float)top_blob->w;
                  iStack_e8 = top_blob->h;
                  sVar8 = top_blob->elemsize;
                  local_100 = top_blob->elempack;
                  local_f8 = top_blob->allocator;
                  sVar48 = (long)iStack_e8 * (long)(int)fStack_ec;
                  local_118 = (undefined1  [8])
                              ((long)top_blob->data +
                              uVar52 * sVar8 * sVar48 + top_blob->cstep * uVar49 * sVar8);
                  fStack_110 = 0.0;
                  fStack_10c = 0.0;
                  local_108 = (float)sVar8;
                  uStack_104 = (undefined4)(sVar8 >> 0x20);
                  local_f0 = 2.8026e-45;
                  iStack_e4 = 1;
                  iStack_e0 = 1;
                  uVar38 = (int)uVar52 - (this->super_Padding).front;
                  if ((int)uVar38 < 0 || local_64 <= (int)uVar38) {
                    local_d8._0_4_ = (int)sVar48;
                    if (0 < (int)local_d8) {
                      puVar41 = (undefined8 *)local_118;
                      do {
                        *puVar41 = CONCAT44(fStack_44,local_48);
                        puVar41[1] = CONCAT44(fStack_3c,fStack_40);
                        puVar41 = puVar41 + 2;
                        local_d8._0_4_ = (int)local_d8 + -1;
                      } while ((int)local_d8 != 0);
                    }
                  }
                  else {
                    local_b8.h = bottom_blob->h;
                    sVar8 = bottom_blob->elemsize;
                    local_b8.elempack = bottom_blob->elempack;
                    local_b8.allocator = bottom_blob->allocator;
                    local_b8.cstep = (long)local_b8.h * (long)bottom_blob->w;
                    local_b8.data =
                         (void *)((long)bottom_blob->data +
                                 uVar38 * sVar8 * local_b8.cstep +
                                 bottom_blob->cstep * uVar49 * sVar8);
                    local_b8.refcount._0_4_ = 0;
                    local_b8.refcount._4_4_ = 0;
                    local_b8.elemsize._0_4_ = (undefined4)sVar8;
                    local_b8.elemsize._4_4_ = (undefined4)(sVar8 >> 0x20);
                    local_b8.w = bottom_blob->w;
                    local_b8.dims = 2;
                    local_b8.d = 1;
                    local_b8.c = 1;
                    local_d8 = sVar48;
                    padding_constant_pack4_sse
                              (&local_b8,(Mat *)local_118,(this->super_Padding).top,
                               (this->super_Padding).bottom,(this->super_Padding).left,
                               (this->super_Padding).right,(__m128 *)&local_48);
                    piVar7 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
                    if (piVar7 != (int *)0x0) {
                      LOCK();
                      *piVar7 = *piVar7 + -1;
                      UNLOCK();
                      if (*piVar7 == 0) {
                        if (local_b8.allocator == (Allocator *)0x0) {
                          if (local_b8.data != (void *)0x0) {
                            free(local_b8.data);
                          }
                        }
                        else {
                          (*(local_b8.allocator)->_vptr_Allocator[3])();
                        }
                      }
                    }
                    local_b8.cstep = 0;
                    local_b8.data = (void *)0x0;
                    local_b8.refcount._0_4_ = 0;
                    local_b8.refcount._4_4_ = 0;
                    local_b8.elemsize._0_4_ = 0;
                    local_b8.elemsize._4_4_ = 0;
                    local_b8.elempack = 0;
                    local_b8.dims = 0;
                    local_b8.w = 0;
                    local_b8.h = 0;
                    local_b8.d = 0;
                    local_b8.c = 0;
                    sVar48 = local_d8;
                  }
                  local_d8 = sVar48;
                  piVar7 = (int *)CONCAT44(fStack_10c,fStack_110);
                  if (piVar7 != (int *)0x0) {
                    LOCK();
                    *piVar7 = *piVar7 + -1;
                    UNLOCK();
                    if (*piVar7 == 0) {
                      if (local_f8 == (Allocator *)0x0) {
                        if (local_118 != (undefined1  [8])0x0) {
                          free((void *)local_118);
                        }
                      }
                      else {
                        (*local_f8->_vptr_Allocator[3])();
                      }
                    }
                  }
                  uVar52 = uVar52 + 1;
                } while (uVar52 != uVar40);
              }
              uVar49 = uVar49 + 1;
            } while (uVar49 != local_70);
            unaff_EBP = 0;
            iVar47 = (int)local_c8;
          }
        }
      }
      if (iVar47 == 0) {
        return unaff_EBP;
      }
    }
  }
  local_118._0_4_ = SUB84(bottom_blob->data,0);
  local_118._4_4_ = (undefined4)((ulong)bottom_blob->data >> 0x20);
  piVar7 = bottom_blob->refcount;
  fStack_110 = SUB84(piVar7,0);
  fStack_10c = (float)((ulong)piVar7 >> 0x20);
  local_108 = (float)bottom_blob->elemsize;
  uStack_104 = (undefined4)(bottom_blob->elemsize >> 0x20);
  local_100 = bottom_blob->elempack;
  local_f8 = bottom_blob->allocator;
  uVar10 = bottom_blob->dims;
  uVar11 = bottom_blob->w;
  uVar12 = bottom_blob->h;
  uVar13 = bottom_blob->d;
  iStack_e0 = bottom_blob->c;
  local_d8 = bottom_blob->cstep;
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + 1;
    UNLOCK();
  }
  local_f0 = (float)uVar10;
  fStack_ec = (float)uVar11;
  iStack_e8 = uVar12;
  iStack_e4 = uVar13;
  if (iVar37 != 1) {
    local_b8.data = *(void **)local_c0;
    uVar14 = local_c0->openmp_blocktime;
    uVar15 = local_c0->use_winograd_convolution;
    uVar17 = local_c0->use_sgemm_convolution;
    uVar19 = local_c0->use_int8_inference;
    uVar21 = local_c0->use_vulkan_compute;
    uVar20 = CONCAT11(uVar21,uVar19);
    uVar18 = CONCAT21(uVar20,uVar17);
    uVar16 = CONCAT31(uVar18,uVar15);
    local_b8.allocator = *(Allocator **)&local_c0->use_bf16_storage;
    local_b8._40_8_ = *(undefined8 *)&local_c0->vulkan_device_index;
    uVar22 = local_c0->flush_denormals;
    uVar23 = local_c0->use_local_pool_allocator;
    uVar25 = local_c0->use_shader_local_memory;
    uVar27 = local_c0->use_cooperative_matrix;
    uVar29 = local_c0->use_winograd23_convolution;
    uVar28 = CONCAT11(uVar29,uVar27);
    uVar26 = CONCAT21(uVar28,uVar25);
    uVar24 = CONCAT31(uVar26,uVar23);
    uVar30._0_1_ = local_c0->use_winograd43_convolution;
    uVar30._1_1_ = local_c0->use_winograd63_convolution;
    uVar30._2_1_ = local_c0->use_a53_a55_optimized_kernel;
    uVar30._3_1_ = local_c0->use_fp16_uniform;
    uVar31 = local_c0->use_int8_uniform;
    uVar32 = local_c0->use_reserved_9;
    uVar34 = local_c0->use_reserved_10;
    uVar36 = local_c0->use_reserved_11;
    uVar35 = CONCAT11(uVar36,uVar34);
    uVar33 = CONCAT21(uVar35,uVar32);
    uVar30._4_4_ = CONCAT31(uVar33,uVar31);
    local_b8.c = (int)uVar30;
    local_b8.elemsize._0_4_ = SUB84(local_c0->workspace_allocator,0);
    local_b8.elemsize._4_4_ = (undefined4)((ulong)local_c0->workspace_allocator >> 0x20);
    local_b8.refcount._0_4_ = SUB84(local_c0->workspace_allocator,0);
    local_b8.refcount._4_4_ = (undefined4)((ulong)local_c0->workspace_allocator >> 0x20);
    local_b8.elempack = uVar14;
    local_b8._28_4_ = uVar16;
    local_b8.h = uVar22;
    local_b8.d = uVar24;
    local_b8._60_4_ = uVar30._4_4_;
    convert_packing(bottom_blob,(Mat *)local_118,1,(Option *)&local_b8);
    if (CONCAT44(local_118._4_4_,local_118._0_4_) == 0 || (long)iStack_e0 * local_d8 == 0) {
      iVar37 = -100;
      goto LAB_00435f66;
    }
  }
  iVar37 = Padding::forward(&this->super_Padding,(Mat *)local_118,top_blob,local_c0);
LAB_00435f66:
  piVar7 = (int *)CONCAT44(fStack_10c,fStack_110);
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + -1;
    UNLOCK();
    if (*piVar7 == 0) {
      if (local_f8 == (Allocator *)0x0) {
        if ((void *)CONCAT44(local_118._4_4_,local_118._0_4_) != (void *)0x0) {
          free((void *)CONCAT44(local_118._4_4_,local_118._0_4_));
        }
      }
      else {
        (*local_f8->_vptr_Allocator[3])();
      }
    }
  }
  return iVar37;
}

Assistant:

int Padding_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (top == 0 && bottom == 0 && left == 0 && right == 0 && front == 0 && behind == 0)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int elembits = bottom_blob.elembits();

    if (elembits == 8)
        return forward_int8(bottom_blob, top_blob, opt);

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 16 == 0 ? 16 : outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 16 == 0 && out_elempack == 16 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m512 pad_value = _mm512_set1_ps(value);
                padding_constant_pack16_avx512(bottom_blob, top_blob, 0, 0, left / 16, right / 16, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 16 == 0 ? 16 : outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 16 == 0 && out_elempack == 16 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m512 pad_value = _mm512_set1_ps(value);
                padding_constant_pack16_avx512(bottom_blob, top_blob, top / 16, bottom / 16, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 16 == 0 ? 16 : outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 16 == 0 && out_elempack == 16 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m512 pad_value = per_channel_pad_data_size ? _mm512_loadu_ps((const float*)per_channel_pad_data + q * 16) : _mm512_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack16_avx512(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack16_avx512(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack16_avx512(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m512 pad_value = per_channel_pad_data_size ? _mm512_loadu_ps((const float*)per_channel_pad_data + q * 16) : _mm512_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack16_avx512(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m256 pad_value = _mm256_set1_ps(value);
                padding_constant_pack8_avx(bottom_blob, top_blob, 0, 0, left / 8, right / 8, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m256 pad_value = _mm256_set1_ps(value);
                padding_constant_pack8_avx(bottom_blob, top_blob, top / 8, bottom / 8, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 8 == 0 && out_elempack == 8 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m256 pad_value = per_channel_pad_data_size ? _mm256_loadu_ps((const float*)per_channel_pad_data + q * 8) : _mm256_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack8_avx(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack8_avx(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack8_avx(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m256 pad_value = per_channel_pad_data_size ? _mm256_loadu_ps((const float*)per_channel_pad_data + q * 8) : _mm256_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack8_avx(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

#if __AVX__
            int out_elempack = outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outw % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 4 == 0 && out_elempack == 4 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m128 pad_value = _mm_set1_ps(value);
                padding_constant_pack4_sse(bottom_blob, top_blob, 0, 0, left / 4, right / 4, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

#if __AVX__
            int out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outh % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 4 == 0 && out_elempack == 4 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m128 pad_value = _mm_set1_ps(value);
                padding_constant_pack4_sse(bottom_blob, top_blob, top / 4, bottom / 4, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

#if __AVX__
            int out_elempack = outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outc % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 4 == 0 && out_elempack == 4 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m128 pad_value = per_channel_pad_data_size ? _mm_loadu_ps((const float*)per_channel_pad_data + q * 4) : _mm_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack4_sse(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack4_sse(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack4_sse(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m128 pad_value = per_channel_pad_data_size ? _mm_loadu_ps((const float*)per_channel_pad_data + q * 4) : _mm_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack4_sse(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
        if (bottom_blob_unpacked.empty())
            return -100;
    }

    return Padding::forward(bottom_blob_unpacked, top_blob, opt);
}